

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManPrintPlacement(Gia_Man_t *p)

{
  Gia_Plc_t **ppGVar1;
  Gia_Plc_t GVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  ppGVar1 = &p->pPlacement;
  if (*ppGVar1 == (Gia_Plc_t *)0x0) {
    return;
  }
  lVar4 = (long)p->nObjs;
  if (lVar4 < 1) {
    uVar3 = 0;
    uVar6 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    uVar3 = 0;
    do {
      GVar2 = (*ppGVar1)[lVar5];
      p = (Gia_Man_t *)(ulong)(uint)GVar2;
      uVar3 = (ulong)((int)uVar3 + ((uint)GVar2 & 1));
      uVar6 = (ulong)((int)uVar6 + (uint)(((uint)GVar2 >> 0x10 & 1) != 0));
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  Abc_Print((int)p,"Placement:  Objects = %8d.  Fixed = %8d.  Undef = %8d.\n",lVar4,uVar3,uVar6);
  return;
}

Assistant:

void Gia_ManPrintPlacement( Gia_Man_t * p )
{
    int i, nFixed = 0, nUndef = 0;
    if ( p->pPlacement == NULL )
        return;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        nFixed += p->pPlacement[i].fFixed;
        nUndef += p->pPlacement[i].fUndef;
    }
    Abc_Print( 1, "Placement:  Objects = %8d.  Fixed = %8d.  Undef = %8d.\n", Gia_ManObjNum(p), nFixed, nUndef );
}